

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.cpp
# Opt level: O0

void read_pic_parameter_set_rbsp(h264_stream_t *h,bs_t *b)

{
  pps_t *__s;
  uint32_t uVar1;
  int32_t iVar2;
  int iVar3;
  uint32_t *puVar4;
  int local_30;
  int local_2c;
  int i_group;
  int i;
  pps_t *pps;
  int pps_id;
  bs_t *b_local;
  h264_stream_t *h_local;
  
  uVar1 = bs_read_ue(b);
  __s = h->pps_table[(int)uVar1];
  h->pps = __s;
  memset(__s,0,0x168);
  __s->pic_parameter_set_id = uVar1;
  uVar1 = bs_read_ue(b);
  __s->seq_parameter_set_id = uVar1;
  uVar1 = bs_read_u1(b);
  __s->entropy_coding_mode_flag = uVar1;
  h->info->encoding_type = __s->entropy_coding_mode_flag;
  uVar1 = bs_read_u1(b);
  __s->bottom_field_pic_order_in_frame_present_flag = uVar1;
  uVar1 = bs_read_ue(b);
  __s->num_slice_groups_minus1 = uVar1;
  if (0 < __s->num_slice_groups_minus1) {
    uVar1 = bs_read_ue(b);
    __s->slice_group_map_type = uVar1;
    if (__s->slice_group_map_type == 0) {
      for (local_30 = 0; local_30 <= __s->num_slice_groups_minus1; local_30 = local_30 + 1) {
        uVar1 = bs_read_ue(b);
        __s->run_length_minus1[local_30] = uVar1;
      }
    }
    else if (__s->slice_group_map_type == 2) {
      for (local_30 = 0; local_30 < __s->num_slice_groups_minus1; local_30 = local_30 + 1) {
        uVar1 = bs_read_ue(b);
        __s->top_left[local_30] = uVar1;
        uVar1 = bs_read_ue(b);
        __s->bottom_right[local_30] = uVar1;
      }
    }
    else if (((__s->slice_group_map_type == 3) || (__s->slice_group_map_type == 4)) ||
            (__s->slice_group_map_type == 5)) {
      uVar1 = bs_read_u1(b);
      __s->slice_group_change_direction_flag = uVar1;
      uVar1 = bs_read_ue(b);
      __s->slice_group_change_rate_minus1 = uVar1;
    }
    else if (__s->slice_group_map_type == 6) {
      uVar1 = bs_read_ue(b);
      __s->pic_size_in_map_units_minus1 = uVar1;
      iVar3 = intlog2(__s->num_slice_groups_minus1 + 1);
      __s->slice_group_id_bytes = iVar3;
      std::vector<int,_std::allocator<int>_>::resize
                (&__s->slice_group_id,(long)(__s->pic_size_in_map_units_minus1 + 1));
      for (local_2c = 0; local_2c <= __s->pic_size_in_map_units_minus1; local_2c = local_2c + 1) {
        uVar1 = bs_read_u(b,__s->slice_group_id_bytes);
        puVar4 = (uint32_t *)
                 std::vector<int,_std::allocator<int>_>::operator[]
                           (&__s->slice_group_id,(long)local_2c);
        *puVar4 = uVar1;
      }
    }
  }
  uVar1 = bs_read_ue(b);
  __s->num_ref_idx_l0_active_minus1 = uVar1;
  uVar1 = bs_read_ue(b);
  __s->num_ref_idx_l1_active_minus1 = uVar1;
  uVar1 = bs_read_u1(b);
  __s->weighted_pred_flag = uVar1;
  uVar1 = bs_read_u(b,2);
  __s->weighted_bipred_idc = uVar1;
  iVar2 = bs_read_se(b);
  __s->pic_init_qp_minus26 = iVar2;
  iVar2 = bs_read_se(b);
  __s->pic_init_qs_minus26 = iVar2;
  iVar2 = bs_read_se(b);
  __s->chroma_qp_index_offset = iVar2;
  uVar1 = bs_read_u1(b);
  __s->deblocking_filter_control_present_flag = uVar1;
  uVar1 = bs_read_u1(b);
  __s->constrained_intra_pred_flag = uVar1;
  uVar1 = bs_read_u1(b);
  __s->redundant_pic_cnt_present_flag = uVar1;
  iVar3 = more_rbsp_data_in_pps(h,b);
  __s->_more_rbsp_data_present = iVar3;
  if (__s->_more_rbsp_data_present != 0) {
    uVar1 = bs_read_u1(b);
    __s->transform_8x8_mode_flag = uVar1;
    uVar1 = bs_read_u1(b);
    __s->pic_scaling_matrix_present_flag = uVar1;
    if (__s->pic_scaling_matrix_present_flag != 0) {
      for (local_2c = 0; local_2c < __s->transform_8x8_mode_flag * 2 + 6; local_2c = local_2c + 1) {
        uVar1 = bs_read_u1(b);
        __s->pic_scaling_list_present_flag[local_2c] = uVar1;
        if (__s->pic_scaling_list_present_flag[local_2c] != 0) {
          if (local_2c < 6) {
            read_scaling_list(b,__s->ScalingList4x4[local_2c],0x10,
                              __s->UseDefaultScalingMatrix4x4Flag[local_2c]);
          }
          else {
            read_scaling_list(b,__s->ScalingList8x8[local_2c + -6],0x40,
                              __s->UseDefaultScalingMatrix8x8Flag[local_2c + -6]);
          }
        }
      }
    }
    iVar2 = bs_read_se(b);
    __s->second_chroma_qp_index_offset = iVar2;
  }
  read_rbsp_trailing_bits(h,b);
  return;
}

Assistant:

void read_pic_parameter_set_rbsp(h264_stream_t* h, bs_t* b)
{
    int pps_id = bs_read_ue(b);
    pps_t* pps = h->pps = h->pps_table[pps_id] ;

    memset(pps, 0, sizeof(pps_t));

    int i;
    int i_group;

    pps->pic_parameter_set_id = pps_id;
    pps->seq_parameter_set_id = bs_read_ue(b);
    pps->entropy_coding_mode_flag = bs_read_u1(b);

    // add by Late Lee
    h->info->encoding_type = pps->entropy_coding_mode_flag;

    //2005年版本此处为pps->pic_order_present_flag，2013年版本为bottom_field_pic_order_in_frame_present_flag
    pps->bottom_field_pic_order_in_frame_present_flag = bs_read_u1(b);
    pps->num_slice_groups_minus1 = bs_read_ue(b);

    if( pps->num_slice_groups_minus1 > 0 )
    {
        pps->slice_group_map_type = bs_read_ue(b);
        if( pps->slice_group_map_type == 0 )
        {
            for( i_group = 0; i_group <= pps->num_slice_groups_minus1; i_group++ )
            {
                pps->run_length_minus1[ i_group ] = bs_read_ue(b);
            }
        }
        else if( pps->slice_group_map_type == 2 )
        {
            for( i_group = 0; i_group < pps->num_slice_groups_minus1; i_group++ )
            {
                pps->top_left[ i_group ] = bs_read_ue(b);
                pps->bottom_right[ i_group ] = bs_read_ue(b);
            }
        }
        else if( pps->slice_group_map_type == 3 ||
                 pps->slice_group_map_type == 4 ||
                 pps->slice_group_map_type == 5 )
        {
            pps->slice_group_change_direction_flag = bs_read_u1(b);
            pps->slice_group_change_rate_minus1 = bs_read_ue(b);
        }
        else if( pps->slice_group_map_type == 6 )
        {
            pps->pic_size_in_map_units_minus1 = bs_read_ue(b);
            pps->slice_group_id_bytes = intlog2( pps->num_slice_groups_minus1 + 1 );
            pps->slice_group_id.resize(pps->pic_size_in_map_units_minus1 + 1);
            for( i = 0; i <= pps->pic_size_in_map_units_minus1; i++ )
            {
                pps->slice_group_id[ i ] = bs_read_u(b,  pps->slice_group_id_bytes); // was u(v)
            }
        }
    }
    pps->num_ref_idx_l0_active_minus1 = bs_read_ue(b);
    pps->num_ref_idx_l1_active_minus1 = bs_read_ue(b);
    pps->weighted_pred_flag = bs_read_u1(b);
    pps->weighted_bipred_idc = bs_read_u(b,2);
    pps->pic_init_qp_minus26 = bs_read_se(b);
    pps->pic_init_qs_minus26 = bs_read_se(b);
    pps->chroma_qp_index_offset = bs_read_se(b);
    pps->deblocking_filter_control_present_flag = bs_read_u1(b);
    pps->constrained_intra_pred_flag = bs_read_u1(b);
    pps->redundant_pic_cnt_present_flag = bs_read_u1(b);

    pps->_more_rbsp_data_present = more_rbsp_data_in_pps(h, b);
    if( pps->_more_rbsp_data_present )
    {
        pps->transform_8x8_mode_flag = bs_read_u1(b);
        pps->pic_scaling_matrix_present_flag = bs_read_u1(b);
        if( pps->pic_scaling_matrix_present_flag )
        {
            for( i = 0; i < 6 + 2* pps->transform_8x8_mode_flag; i++ )
            {
                pps->pic_scaling_list_present_flag[ i ] = bs_read_u1(b);
                if( pps->pic_scaling_list_present_flag[ i ] )
                {
                    if( i < 6 )
                    {
                        read_scaling_list( b, pps->ScalingList4x4[ i ], 16,
                                           pps->UseDefaultScalingMatrix4x4Flag[ i ] );
                    }
                    else
                    {
                        read_scaling_list( b, pps->ScalingList8x8[ i - 6 ], 64,
                                           pps->UseDefaultScalingMatrix8x8Flag[ i - 6 ] );
                    }
                }
            }
        }
        pps->second_chroma_qp_index_offset = bs_read_se(b);
    }
    read_rbsp_trailing_bits(h, b);
}